

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::emptyConstructorTest<true>(ViewTest *this)

{
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator_type local_51;
  View<int,_true,_std::allocator<unsigned_long>_> local_50;
  
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&local_50,&local_51);
  local_51 = (allocator_type)(local_50.geometry_.size_ == 0);
  test((bool *)&local_51);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_50.geometry_);
  return;
}

Assistant:

void ViewTest::emptyConstructorTest() {
    andres::View<int, constTarget> v;   
    
    test(v.size() == 0
        );
}